

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_commitment_serialize
              (secp256k1_context *ctx,uchar *output,secp256k1_pedersen_commitment *commit)

{
  int iVar1;
  secp256k1_fe r;
  secp256k1_ge ge;
  secp256k1_fe local_90;
  secp256k1_ge local_68;
  
  if (output == (uchar *)0x0) {
    secp256k1_pedersen_commitment_serialize_cold_2();
  }
  else {
    if (commit != (secp256k1_pedersen_commitment *)0x0) {
      secp256k1_pedersen_commitment_load(&local_68,commit);
      iVar1 = secp256k1_fe_sqrt(&local_90,&local_68.y);
      *output = (byte)iVar1 ^ 9;
      secp256k1_fe_normalize_var(&local_68.x);
      secp256k1_fe_get_b32(output + 1,&local_68.x);
      return 1;
    }
    secp256k1_pedersen_commitment_serialize_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_commitment_serialize(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pedersen_commitment* commit) {
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(commit != NULL);

    secp256k1_pedersen_commitment_load(&ge, commit);

    output[0] = 9 ^ secp256k1_fe_is_quad_var(&ge.y);
    secp256k1_fe_normalize_var(&ge.x);
    secp256k1_fe_get_b32(&output[1], &ge.x);
    return 1;
}